

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_upscale_impl(ggml_context *ctx,ggml_tensor *a,int ne0,int ne1,int ne2,int ne3,
                 ggml_scale_mode mode)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  
  local_38 = (long)ne0;
  if (local_38 < a->ne[0]) {
    pcVar2 = "a->ne[0] <= ne0";
    line = 0x1084;
  }
  else {
    local_30 = (long)ne1;
    if (local_30 < a->ne[1]) {
      pcVar2 = "a->ne[1] <= ne1";
      line = 0x1085;
    }
    else {
      local_28 = (long)ne2;
      if (local_28 < a->ne[2]) {
        pcVar2 = "a->ne[2] <= ne2";
        line = 0x1086;
      }
      else {
        local_20 = (long)ne3;
        if (a->ne[3] <= local_20) {
          pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,&local_38,(ggml_tensor *)0x0,0);
          pgVar1->op_params[0] = mode;
          pgVar1->op = GGML_OP_UPSCALE;
          pgVar1->src[0] = a;
          return pgVar1;
        }
        pcVar2 = "a->ne[3] <= ne3";
        line = 0x1087;
      }
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_upscale_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   ne0,
        int                   ne1,
        int                   ne2,
        int                   ne3,
        enum ggml_scale_mode  mode) {
    GGML_ASSERT(a->ne[0] <= ne0);
    GGML_ASSERT(a->ne[1] <= ne1);
    GGML_ASSERT(a->ne[2] <= ne2);
    GGML_ASSERT(a->ne[3] <= ne3);

    struct ggml_tensor * result = ggml_new_tensor_4d(ctx, a->type, ne0, ne1, ne2, ne3);

    ggml_set_op_params_i32(result, 0, mode);

    result->op     = GGML_OP_UPSCALE;
    result->src[0] = a;

    return result;
}